

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.cpp
# Opt level: O2

VRDatumPtr __thiscall MinVR::CreateVRDatumIntArray(MinVR *this,void *pData)

{
  VRDatum_conflict *pValue;
  VRDatumPtrRC *extraout_RDX;
  VRDatumPtr VVar1;
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  pValue = (VRDatum_conflict *)operator_new(0x68);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_30,
             (vector<int,_std::allocator<int>_> *)pData);
  VRDatumIntArray::VRDatumIntArray((VRDatumIntArray *)pValue,(VRIntArray *)&local_30);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
  VRDatumPtr::VRDatumPtr((VRDatumPtr *)this,pValue);
  VVar1.reference = extraout_RDX;
  VVar1.pData = (VRDatum_conflict *)this;
  return VVar1;
}

Assistant:

VRDatumPtr CreateVRDatumIntArray(void *pData) {
  VRDatumIntArray *obj =
    new VRDatumIntArray(*static_cast<VRIntArray *>(pData));
  return VRDatumPtr(obj);
}